

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

Var Js::JavascriptNumber::EntryToPrecision(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  JavascriptString *pJVar10;
  char *pcVar11;
  char *pcVar12;
  ScriptContext *pSVar13;
  uint uVar14;
  char *pcVar15;
  int in_stack_00000010;
  undefined4 local_70;
  undefined4 uStack_6c;
  Type TStack_68;
  CallInfo local_60;
  CallInfo callInfo_local;
  double value;
  Var result;
  ArgumentReader args;
  
  pSVar13 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar13->threadContext,0xc00,pSVar13,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x2b5,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cdbd51;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  result = (Var)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,&local_60);
  pSVar13 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x2b8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00cdbd51;
    *puVar7 = 0;
  }
  if (((ulong)result & 0xffffff) == 0) goto LAB_00cdbd47;
  args.super_Arguments.Values = (Type)pSVar13;
  pvVar8 = Arguments::operator[]((Arguments *)&result,0);
  BVar4 = GetThisValue(pvVar8,(double *)&callInfo_local);
  if (BVar4 != 0) {
    if (((ulong)result & 0xfffffe) == 0) goto LAB_00cdbacf;
    pvVar8 = Arguments::operator[]((Arguments *)&result,1);
    if (pvVar8 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cdbd51;
      *puVar7 = 0;
LAB_00cdba5b:
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
      if (pRVar9 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00cdbd51;
        *puVar7 = 0;
      }
      TVar1 = ((pRVar9->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) {
LAB_00cdbacf:
          pvVar8 = Arguments::operator[]((Arguments *)&result,0);
          pJVar10 = JavascriptConversion::ToString
                              (pvVar8,(ScriptContext *)args.super_Arguments.Values);
          return pJVar10;
        }
      }
      else {
        BVar4 = RecyclableObject::IsExternal(pRVar9);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          pcVar15 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
          ;
          pcVar12 = "(typeId < TypeIds_Limit || obj->IsExternal())";
          pcVar11 = "GetTypeId aValue has invalid TypeId";
          uVar14 = 0xe;
          goto LAB_00cdbb38;
        }
      }
    }
    else if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
             ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pvVar8 >> 0x32 == 0 && ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00cdba5b;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar15 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      pcVar12 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar11 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar14 = 0x2a;
LAB_00cdbb38:
      bVar3 = Throw::ReportAssert(pcVar15,uVar14,pcVar12,pcVar11);
      if (!bVar3) goto LAB_00cdbd51;
      *puVar7 = 0;
    }
    pvVar8 = Arguments::operator[]((Arguments *)&result,1);
    pSVar13 = (ScriptContext *)args.super_Arguments.Values;
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
        uVar6 = JavascriptConversion::ToInt32_Full
                          (pvVar8,(ScriptContext *)args.super_Arguments.Values);
        pvVar8 = (Var)(ulong)uVar6;
        goto LAB_00cdbc41;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00cdbd51;
      *puVar7 = 0;
    }
    pSVar13 = (ScriptContext *)args.super_Arguments.Values;
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000) {
LAB_00cdbc41:
      args.super_Arguments.Values = (Type)callInfo_local;
      pJVar10 = ToStringNanOrInfinite((double)callInfo_local,pSVar13);
      if (pJVar10 == (JavascriptString *)0x0) {
        if ((int)pvVar8 - 0x16U < 0xffffffeb) {
          JavascriptError::ThrowRangeError(pSVar13,-0x7ff5ec5d,(PCWSTR)0x0);
        }
        pJVar10 = (JavascriptString *)
                  FormatDoubleToString
                            ((double)args.super_Arguments.Values,FormatPrecision,(int)pvVar8,pSVar13
                            );
      }
      return pJVar10;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (bVar3) {
      *puVar7 = 0;
      pSVar13 = (ScriptContext *)args.super_Arguments.Values;
      goto LAB_00cdbc41;
    }
    goto LAB_00cdbd51;
  }
  pvVar8 = Arguments::operator[]((Arguments *)&result,0);
  if (pvVar8 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00cdbd51;
    *puVar7 = 0;
LAB_00cdb97c:
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cdbd51;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar9->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      pSVar13 = (ScriptContext *)args.super_Arguments.Values;
      if (TVar1 == TypeIds_HostDispatch) {
        pvVar8 = Arguments::operator[]((Arguments *)&result,0);
        pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
        local_70 = result._0_4_;
        uStack_6c = result._4_4_;
        TStack_68._0_4_ = args.super_Arguments.Info._0_4_;
        TStack_68._4_4_ = args.super_Arguments.Info._4_4_;
        iVar5 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar9,EntryToPrecision,&local_70,&value);
        pSVar13 = (ScriptContext *)args.super_Arguments.Values;
        if (iVar5 != 0) {
          return (Var)value;
        }
      }
      goto LAB_00cdbd47;
    }
    BVar4 = RecyclableObject::IsExternal(pRVar9);
    pSVar13 = (ScriptContext *)args.super_Arguments.Values;
    if (BVar4 != 0) goto LAB_00cdbd47;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    pcVar12 = "(typeId < TypeIds_Limit || obj->IsExternal())";
    pcVar11 = "GetTypeId aValue has invalid TypeId";
    uVar14 = 0xe;
  }
  else {
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      pSVar13 = (ScriptContext *)args.super_Arguments.Values;
      if (((ulong)pvVar8 >> 0x32 != 0) || (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000))
      goto LAB_00cdbd47;
      goto LAB_00cdb97c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar12 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar11 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar14 = 0x2a;
  }
  bVar3 = Throw::ReportAssert(pcVar15,uVar14,pcVar12,pcVar11);
  if (!bVar3) {
LAB_00cdbd51:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar7 = 0;
  pSVar13 = (ScriptContext *)args.super_Arguments.Values;
LAB_00cdbd47:
  JavascriptError::ThrowTypeError(pSVar13,-0x7ff5ec3c,L"Number.prototype.toPrecision");
}

Assistant:

Var JavascriptNumber::EntryToPrecision(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toPrecision"));
        }
        AssertMsg(args.Info.Count > 0, "negative arg count");

        // spec implies ToPrec is not generic. 'this' must be a number
        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToPrecision, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toPrecision"));
        }
        if(args.Info.Count < 2 || JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
        {
            return JavascriptConversion::ToString(args[0], scriptContext);
        }

        int precision;
        Var aPrecision = args[1];
        if(TaggedInt::Is(aPrecision))
        {
            precision = TaggedInt::ToInt32(aPrecision);
        }
        else
        {
            precision = (int) JavascriptConversion::ToInt32(aPrecision, scriptContext);
        }

        JavascriptString * nanF;
        if (nullptr != (nanF = ToStringNanOrInfinite(value, scriptContext)))
        {
            return nanF;
        }

        if(precision < 1 || precision > 21)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_PrecisionOutOfRange);
        }
        return FormatDoubleToString(value, NumberUtilities::FormatPrecision, precision, scriptContext);
    }